

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Vec_Int_t * Abc_BufSortByDelay(Buf_Man_t *p,int iPivot)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint Entry;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar3;
  int *piVar4;
  int *pOrder;
  int Slack;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  int iPivot_local;
  Buf_Man_t *p_local;
  
  Vec_IntClear(p->vDelays);
  pObj_00 = Abc_NtkObj(p->pNtk,iPivot);
  pOrder._4_4_ = 0;
  while( true ) {
    iVar2 = Abc_ObjFanoutNum(pObj_00);
    if (iVar2 <= pOrder._4_4_) {
      piVar4 = Vec_IntArray(p->vDelays);
      iVar2 = Vec_IntSize(p->vDelays);
      piVar4 = Abc_QuickSortCost(piVar4,iVar2,0);
      Vec_IntClear(p->vOrder);
      for (pOrder._4_4_ = 0; iVar2 = Vec_IntSize(p->vDelays), pOrder._4_4_ < iVar2;
          pOrder._4_4_ = pOrder._4_4_ + 1) {
        pVVar1 = p->vOrder;
        pAVar3 = Abc_ObjFanout(pObj_00,piVar4[pOrder._4_4_]);
        Entry = Abc_ObjId(pAVar3);
        Vec_IntPush(pVVar1,Entry);
      }
      if (piVar4 != (int *)0x0) {
        free(piVar4);
      }
      return p->vOrder;
    }
    pAVar3 = Abc_ObjFanout(pObj_00,pOrder._4_4_);
    iVar2 = Abc_BufEdgeSlack(p,pObj_00,pAVar3);
    if (iVar2 < 0) break;
    pVVar1 = p->vDelays;
    iVar2 = Abc_MaxInt(0,iVar2);
    Vec_IntPush(pVVar1,iVar2);
    pOrder._4_4_ = pOrder._4_4_ + 1;
  }
  __assert_fail("Slack >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x2ff,"Vec_Int_t *Abc_BufSortByDelay(Buf_Man_t *, int)");
}

Assistant:

Vec_Int_t * Abc_BufSortByDelay( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, Slack, * pOrder;
    Vec_IntClear( p->vDelays );
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack(p, pObj, pFanout);
        assert( Slack >= 0 );
        Vec_IntPush( p->vDelays, Abc_MaxInt(0, Slack) );
    }
    pOrder = Abc_QuickSortCost( Vec_IntArray(p->vDelays), Vec_IntSize(p->vDelays), 0 );
    Vec_IntClear( p->vOrder );
    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
        Vec_IntPush( p->vOrder, Abc_ObjId(Abc_ObjFanout(pObj, pOrder[i])) );
    ABC_FREE( pOrder );
//    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
//        printf( "%5d - %5d   ", Vec_IntEntry(p->vOrder, i), Abc_BufEdgeSlack(p, pObj, Abc_NtkObj(p->pNtk, Vec_IntEntry(p->vOrder, i))) );
    return p->vOrder;        
}